

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O3

void __thiscall
ECdecoding::ECdecoding
          (ECdecoding *this,string *inp,FreqTable *freqs,unordered_map<string,_char2double> *pMap,
          bool withCWProbs,json *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  uint32_t uVar7;
  reference pvVar8;
  double dVar9;
  uint ret;
  undefined8 local_60;
  unordered_map<string,_char2double> *local_58;
  unordered_map<string,_std::pair<int,_SeqEntry>_> *local_50;
  btree_multiset<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>_>
  *local_48;
  double local_40;
  double local_38;
  
  local_58 = pMap;
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"decode");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"length");
  bVar6 = nlohmann::operator<=<int,_0>(pvVar8,0);
  if (bVar6) {
    uVar7 = (uint32_t)inp->_M_string_length;
  }
  else {
    pvVar8 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)config,"decode");
    pvVar8 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar8,"length");
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
              (pvVar8,(uint *)&local_60);
    uVar7 = (uint32_t)local_60;
  }
  paVar1 = &(this->readSeq).field_2;
  this->messageLen = uVar7;
  this->withCwProbs = withCWProbs;
  paVar2 = &inp->field_2;
  (this->readSeq)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (inp->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&inp->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->readSeq).field_2 + 8) = uVar5;
  }
  else {
    (this->readSeq)._M_dataplus._M_p = pcVar4;
    (this->readSeq).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->readSeq)._M_string_length = inp->_M_string_length;
  (inp->_M_dataplus)._M_p = (pointer)paVar2;
  inp->_M_string_length = 0;
  (inp->field_2)._M_local_buf[0] = '\0';
  (this->outp)._M_dataplus._M_p = (pointer)&(this->outp).field_2;
  (this->outp)._M_string_length = 0;
  (this->outp).field_2._M_local_buf[0] = '\0';
  this->endFailed = true;
  FreqTable::FreqTable(&this->frequencyMap,freqs);
  local_48 = &this->queue;
  psVar3 = &(this->crcCheckpoints).mMask;
  (this->queue).
  super_btree_multiset_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  .
  super_btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  .tree_.root_ = (node_type *)
                 absl::container_internal::
                 btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
                 ::EmptyNode()::empty_node;
  (this->queue).
  super_btree_multiset_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  .
  super_btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  .tree_.rightmost_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_*,_2UL,_false>
  .value = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            *)absl::container_internal::
              btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
              ::EmptyNode()::empty_node;
  local_50 = &this->crcCheckpoints;
  (this->queue).
  super_btree_multiset_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  .
  super_btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
  .tree_.size_ = 0;
  (this->crcCheckpoints).
  super_NodeAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>_>,_4UL,_16384UL,_false>
  .
  super_BulkPoolAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>_>,_4UL,_16384UL>
  .mHead = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>_>
            *)0x0;
  (this->crcCheckpoints).
  super_NodeAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>_>,_4UL,_16384UL,_false>
  .
  super_BulkPoolAllocator<robin_hood::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>_>,_4UL,_16384UL>
  .mListForFree =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>_>
        **)0x0;
  (this->crcCheckpoints).mHashMultiplier = 0xc4ceb9fe1a85ec53;
  (this->crcCheckpoints).mKeyVals = (Node *)psVar3;
  (this->crcCheckpoints).mInfo = (uint8_t *)psVar3;
  (this->crcCheckpoints).mNumElements = 0;
  (this->crcCheckpoints).mMask = 0;
  (this->crcCheckpoints).mMaxNumElementsAllowed = 0;
  (this->crcCheckpoints).mInfoInc = 0x20;
  *(undefined8 *)&(this->crcCheckpoints).mInfoHashShift = 0;
  *(undefined8 *)
   ((long)&(this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->candidates).super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->probMap = local_58;
  this->seqFlag = false;
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"decode");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"metric");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"fano");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"error_probability");
  local_60 = 0.0;
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
            (pvVar8,(double *)&local_60);
  this->errorProb = local_60;
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"decode");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"metric");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"fano");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"rate");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"low");
  local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
            (pvVar8,(int *)&local_60);
  (this->rate)._M_elems[0] = (uint32_t)local_60;
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"decode");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"metric");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"fano");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"rate");
  pvVar8 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar8,"high");
  local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
            (pvVar8,(int *)&local_60);
  (this->rate)._M_elems[1] = (uint32_t)local_60;
  local_58 = (unordered_map<string,_char2double> *)
             (double)((float)(this->rate)._M_elems[0] / (float)(int)(uint32_t)local_60);
  local_40 = this->errorProb + this->errorProb;
  local_38 = log2(local_40);
  local_38 = local_38 - (double)local_58;
  dVar9 = log2(2.0 - local_40);
  (this->fanos)._M_elems[0] = local_38;
  (this->fanos)._M_elems[1] = dVar9 - (double)local_58;
  this->queueCounter = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->config,config);
  return;
}

Assistant:

ECdecoding::ECdecoding(string inp, FreqTable &freqs, robin_hood::unordered_map<string, char2double> &pMap, bool withCWProbs, nlohmann::json &config) :
        messageLen(config["decode"]["length"] <= 0 ? inp.size() : static_cast<uint32_t>(config["decode"]["length"])),
        withCwProbs(withCWProbs),
        readSeq(std::move(inp)),
        endFailed(true),
        frequencyMap(freqs),
        probMap(pMap),
        seqFlag(false),
        errorProb(config["decode"]["metric"]["fano"]["error_probability"]),
        rate({config["decode"]["metric"]["fano"]["rate"]["low"],config["decode"]["metric"]["fano"]["rate"]["high"]}),
        fanos(getFanos(errorProb, rate)),
        queueCounter(0),
        config(config) {}